

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

optional<std::shared_ptr<StatementAstNode>_> * __thiscall
Parser::parseAssignOrExpressionStatement
          (optional<std::shared_ptr<StatementAstNode>_> *__return_storage_ptr__,Parser *this)

{
  int iVar1;
  _Storage<std::shared_ptr<AssignStatementAstNode>,_false> local_48;
  char local_38;
  
  TokenBuffer::currentToken((TokenBuffer *)&local_48._M_value);
  iVar1 = *(int *)&((local_48._M_value.
                     super___shared_ptr<AssignStatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->expression).super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
  if (local_48._M_value.super___shared_ptr<AssignStatementAstNode,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_48._M_value.
               super___shared_ptr<AssignStatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (iVar1 == 0x18) {
    do {
      TokenBuffer::tokenAt
                ((TokenBuffer *)&local_48._M_value,
                 (size_t)(this->tokenBuffer).
                         super___shared_ptr<TokenBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      iVar1 = *(int *)&((local_48._M_value.
                         super___shared_ptr<AssignStatementAstNode,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->expression).
                       super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi;
      if (local_48._M_value.super___shared_ptr<AssignStatementAstNode,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_48._M_value.
                   super___shared_ptr<AssignStatementAstNode,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    } while (iVar1 == 4);
    TokenBuffer::tokenAt
              ((TokenBuffer *)&local_48._M_value,
               (size_t)(this->tokenBuffer).
                       super___shared_ptr<TokenBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    iVar1 = *(int *)&((local_48._M_value.
                       super___shared_ptr<AssignStatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      )->expression).
                     super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
    if (local_48._M_value.super___shared_ptr<AssignStatementAstNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_48._M_value.
                 super___shared_ptr<AssignStatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (iVar1 == 0x12) {
      parseAssignStatement
                ((optional<std::shared_ptr<AssignStatementAstNode>_> *)&local_48._M_value,this);
      (__return_storage_ptr__->super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>
      )._M_payload.super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_engaged = false;
      if (local_38 == '\x01') {
        std::optional<std::shared_ptr<StatementAstNode>>::
        emplace<std::shared_ptr<AssignStatementAstNode>const&>
                  ((optional<std::shared_ptr<StatementAstNode>> *)__return_storage_ptr__,
                   &local_48._M_value);
      }
      goto LAB_0010afe2;
    }
  }
  parseExpressionStatement
            ((optional<std::shared_ptr<ExpressionStatementAstNode>_> *)&local_48._M_value,this);
  (__return_storage_ptr__->super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>).
  _M_payload.super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_engaged = false;
  if (local_38 == '\x01') {
    std::optional<std::shared_ptr<StatementAstNode>>::
    emplace<std::shared_ptr<ExpressionStatementAstNode>const&>
              ((optional<std::shared_ptr<StatementAstNode>> *)__return_storage_ptr__,
               (shared_ptr<ExpressionStatementAstNode> *)&local_48._M_value);
  }
LAB_0010afe2:
  if (local_38 == '\x01') {
    local_38 = 0;
    if (local_48._M_value.super___shared_ptr<AssignStatementAstNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_48._M_value.
                 super___shared_ptr<AssignStatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

const std::optional<std::shared_ptr<StatementAstNode>>
Parser::parseAssignOrExpressionStatement() noexcept {

  if (this->tokenBuffer->currentToken()->tokenType != TokenType::Identifier) {
    return this->parseExpressionStatement();
  }

  std::size_t lookAhead = 1;
  while (this->tokenBuffer->tokenAt(lookAhead)->tokenType == TokenType::WhiteSpace) {
    lookAhead++;
  }

  if (this->tokenBuffer->tokenAt(lookAhead)->tokenType == TokenType::Assign) {
    return this->parseAssignStatement();
  }

  return this->parseExpressionStatement();
}